

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam000000000018d680 = 0x2e2e2e2e2e2e2e;
    uRam000000000018d687._0_1_ = '.';
    uRam000000000018d687._1_1_ = '.';
    uRam000000000018d687._2_1_ = '.';
    uRam000000000018d687._3_1_ = '.';
    uRam000000000018d687._4_1_ = '.';
    uRam000000000018d687._5_1_ = '.';
    uRam000000000018d687._6_1_ = '.';
    uRam000000000018d687._7_1_ = '.';
    DAT_0018d670 = '.';
    DAT_0018d670_1._0_1_ = '.';
    DAT_0018d670_1._1_1_ = '.';
    DAT_0018d670_1._2_1_ = '.';
    DAT_0018d670_1._3_1_ = '.';
    DAT_0018d670_1._4_1_ = '.';
    DAT_0018d670_1._5_1_ = '.';
    DAT_0018d670_1._6_1_ = '.';
    uRam000000000018d678 = 0x2e2e2e2e2e2e2e;
    DAT_0018d67f = 0x2e;
    DAT_0018d660 = '.';
    DAT_0018d660_1._0_1_ = '.';
    DAT_0018d660_1._1_1_ = '.';
    DAT_0018d660_1._2_1_ = '.';
    DAT_0018d660_1._3_1_ = '.';
    DAT_0018d660_1._4_1_ = '.';
    DAT_0018d660_1._5_1_ = '.';
    DAT_0018d660_1._6_1_ = '.';
    uRam000000000018d668._0_1_ = '.';
    uRam000000000018d668._1_1_ = '.';
    uRam000000000018d668._2_1_ = '.';
    uRam000000000018d668._3_1_ = '.';
    uRam000000000018d668._4_1_ = '.';
    uRam000000000018d668._5_1_ = '.';
    uRam000000000018d668._6_1_ = '.';
    uRam000000000018d668._7_1_ = '.';
    DAT_0018d650 = '.';
    DAT_0018d650_1._0_1_ = '.';
    DAT_0018d650_1._1_1_ = '.';
    DAT_0018d650_1._2_1_ = '.';
    DAT_0018d650_1._3_1_ = '.';
    DAT_0018d650_1._4_1_ = '.';
    DAT_0018d650_1._5_1_ = '.';
    DAT_0018d650_1._6_1_ = '.';
    uRam000000000018d658._0_1_ = '.';
    uRam000000000018d658._1_1_ = '.';
    uRam000000000018d658._2_1_ = '.';
    uRam000000000018d658._3_1_ = '.';
    uRam000000000018d658._4_1_ = '.';
    uRam000000000018d658._5_1_ = '.';
    uRam000000000018d658._6_1_ = '.';
    uRam000000000018d658._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam000000000018d648._0_1_ = '.';
    uRam000000000018d648._1_1_ = '.';
    uRam000000000018d648._2_1_ = '.';
    uRam000000000018d648._3_1_ = '.';
    uRam000000000018d648._4_1_ = '.';
    uRam000000000018d648._5_1_ = '.';
    uRam000000000018d648._6_1_ = '.';
    uRam000000000018d648._7_1_ = '.';
    DAT_0018d68f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void printClosedHeader( std::string const& _name ) {
            printOpenHeader( _name );
            stream << getLineOfChars<'.'>() << "\n";
        }